

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::InterfaceBlockBaseCase::init
          (InterfaceBlockBaseCase *this,EVP_PKEY_CTX *ctx)

{
  vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *pvVar1;
  ContextType type;
  GLSLVersion version;
  int extraout_EAX;
  Program *this_00;
  Shader *pSVar2;
  StructType *this_01;
  vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_> *this_02;
  allocator<char> local_179;
  VarType local_178;
  string local_160;
  VarType local_140;
  Layout local_124;
  VariableDeclaration local_110;
  InterfaceBlock precedingInterfaceBlock;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  this_00 = (Program *)operator_new(0x48);
  ProgramInterfaceDefinition::Program::Program(this_00);
  this->m_program = this_00;
  pSVar2 = ProgramInterfaceDefinition::Program::addShader(this_00,SHADERTYPE_COMPUTE,version);
  glu::InterfaceBlock::InterfaceBlock(&precedingInterfaceBlock);
  std::__cxx11::string::assign((char *)&precedingInterfaceBlock.interfaceName);
  precedingInterfaceBlock.layout.binding = 0;
  precedingInterfaceBlock.storage = this->m_storage;
  std::__cxx11::string::assign((char *)&precedingInterfaceBlock.instanceName);
  glu::VarType::VarType(&local_178,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"precedingMember",(allocator<char> *)&local_124);
  glu::Layout::Layout((Layout *)&local_140,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_110,&local_178,&local_160,STORAGE_LAST,INTERPOLATION_LAST,(Layout *)&local_140,0
            );
  pvVar1 = &precedingInterfaceBlock.variables;
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
  emplace_back<glu::VariableDeclaration>(pvVar1,&local_110);
  glu::VariableDeclaration::~VariableDeclaration(&local_110);
  std::__cxx11::string::~string((string *)&local_160);
  glu::VarType::~VarType(&local_178);
  if (this->m_storage == STORAGE_BUFFER) {
    glu::VarType::VarType(&local_140,TYPE_FLOAT,PRECISION_HIGHP);
    glu::VarType::VarType(&local_178,&local_140,-1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"precedingMemberUnsizedArray",&local_179);
    glu::Layout::Layout(&local_124,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_110,&local_178,&local_160,STORAGE_LAST,INTERPOLATION_LAST,&local_124,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>(pvVar1,&local_110);
  }
  else {
    glu::VarType::VarType(&local_140,TYPE_FLOAT,PRECISION_HIGHP);
    glu::VarType::VarType(&local_178,&local_140,2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"precedingMemberArray",&local_179);
    glu::Layout::Layout(&local_124,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_110,&local_178,&local_160,STORAGE_LAST,INTERPOLATION_LAST,&local_124,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>(pvVar1,&local_110);
  }
  glu::VariableDeclaration::~VariableDeclaration(&local_110);
  std::__cxx11::string::~string((string *)&local_160);
  glu::VarType::~VarType(&local_178);
  glu::VarType::~VarType(&local_140);
  this_02 = &(pSVar2->m_defaultBlock).interfaceBlocks;
  std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::push_back
            (this_02,&precedingInterfaceBlock);
  glu::InterfaceBlock::~InterfaceBlock(&precedingInterfaceBlock);
  glu::InterfaceBlock::InterfaceBlock(&precedingInterfaceBlock);
  std::__cxx11::string::assign((char *)&precedingInterfaceBlock.interfaceName);
  precedingInterfaceBlock.layout.binding = 1;
  precedingInterfaceBlock.storage = this->m_storage;
  std::__cxx11::string::assign((char *)&precedingInterfaceBlock.instanceName);
  if (this->m_caseType == CASE_BLOCK_ARRAY) {
    local_110.layout.location = 2;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&precedingInterfaceBlock.dimensions,(int *)&local_110);
  }
  glu::VarType::VarType(&local_178,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"blockMemberBasic",(allocator<char> *)&local_124);
  glu::Layout::Layout((Layout *)&local_140,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_110,&local_178,&local_160,STORAGE_LAST,INTERPOLATION_LAST,(Layout *)&local_140,0
            );
  pvVar1 = &precedingInterfaceBlock.variables;
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
  emplace_back<glu::VariableDeclaration>(pvVar1,&local_110);
  glu::VariableDeclaration::~VariableDeclaration(&local_110);
  std::__cxx11::string::~string((string *)&local_160);
  glu::VarType::~VarType(&local_178);
  glu::VarType::VarType(&local_140,TYPE_FLOAT,PRECISION_HIGHP);
  glu::VarType::VarType(&local_178,&local_140,3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"blockMemberArray",&local_179);
  glu::Layout::Layout(&local_124,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_110,&local_178,&local_160,STORAGE_LAST,INTERPOLATION_LAST,&local_124,0);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
  emplace_back<glu::VariableDeclaration>(pvVar1,&local_110);
  glu::VariableDeclaration::~VariableDeclaration(&local_110);
  std::__cxx11::string::~string((string *)&local_160);
  glu::VarType::~VarType(&local_178);
  glu::VarType::~VarType(&local_140);
  this_01 = (StructType *)operator_new(0x38);
  glu::StructType::StructType(this_01,"StructType");
  glu::VarType::VarType((VarType *)&local_110,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_01,"structMemberBasic",(VarType *)&local_110);
  glu::VarType::~VarType((VarType *)&local_110);
  glu::VarType::VarType((VarType *)&local_160,TYPE_FLOAT,PRECISION_HIGHP);
  glu::VarType::VarType((VarType *)&local_110,(VarType *)&local_160,2);
  glu::StructType::addMember(this_01,"structMemberArray",(VarType *)&local_110);
  glu::VarType::~VarType((VarType *)&local_110);
  glu::VarType::~VarType((VarType *)&local_160);
  glu::VarType::VarType(&local_140,this_01);
  glu::VarType::VarType(&local_178,&local_140,2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"blockMemberStruct",&local_179);
  glu::Layout::Layout(&local_124,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_110,&local_178,&local_160,STORAGE_LAST,INTERPOLATION_LAST,&local_124,0);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
  emplace_back<glu::VariableDeclaration>(pvVar1,&local_110);
  glu::VariableDeclaration::~VariableDeclaration(&local_110);
  std::__cxx11::string::~string((string *)&local_160);
  glu::VarType::~VarType(&local_178);
  glu::VarType::~VarType(&local_140);
  if (this->m_storage == STORAGE_BUFFER) {
    glu::VarType::VarType(&local_140,TYPE_FLOAT,PRECISION_HIGHP);
    glu::VarType::VarType(&local_178,&local_140,-1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"blockMemberUnsizedArray",&local_179);
    glu::Layout::Layout(&local_124,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_110,&local_178,&local_160,STORAGE_LAST,INTERPOLATION_LAST,&local_124,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>(pvVar1,&local_110);
    glu::VariableDeclaration::~VariableDeclaration(&local_110);
    std::__cxx11::string::~string((string *)&local_160);
    glu::VarType::~VarType(&local_178);
    glu::VarType::~VarType(&local_140);
  }
  std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::push_back
            (this_02,&precedingInterfaceBlock);
  glu::InterfaceBlock::~InterfaceBlock(&precedingInterfaceBlock);
  glu::InterfaceBlock::InterfaceBlock(&precedingInterfaceBlock);
  std::__cxx11::string::assign((char *)&precedingInterfaceBlock.interfaceName);
  precedingInterfaceBlock.layout.binding = 3;
  precedingInterfaceBlock.storage = this->m_storage;
  std::__cxx11::string::assign((char *)&precedingInterfaceBlock.instanceName);
  glu::VarType::VarType(&local_178,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"trailingMember",(allocator<char> *)&local_124);
  glu::Layout::Layout((Layout *)&local_140,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_110,&local_178,&local_160,STORAGE_LAST,INTERPOLATION_LAST,(Layout *)&local_140,0
            );
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
  emplace_back<glu::VariableDeclaration>(&precedingInterfaceBlock.variables,&local_110);
  glu::VariableDeclaration::~VariableDeclaration(&local_110);
  std::__cxx11::string::~string((string *)&local_160);
  glu::VarType::~VarType(&local_178);
  std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::push_back
            (this_02,&precedingInterfaceBlock);
  glu::InterfaceBlock::~InterfaceBlock(&precedingInterfaceBlock);
  return extraout_EAX;
}

Assistant:

void InterfaceBlockBaseCase::init (void)
{
	const glu::GLSLVersion				glslVersion	= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
	ProgramInterfaceDefinition::Shader*	shader;

	m_program = new ProgramInterfaceDefinition::Program();
	shader = m_program->addShader(glu::SHADERTYPE_COMPUTE, glslVersion);

	// PrecedingInterface
	{
		glu::InterfaceBlock precedingInterfaceBlock;

		precedingInterfaceBlock.interfaceName	= "PrecedingInterface";
		precedingInterfaceBlock.layout.binding	= 0;
		precedingInterfaceBlock.storage			= m_storage;
		precedingInterfaceBlock.instanceName	= "precedingInstance";

		precedingInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), "precedingMember"));

		// Unsized array type
		if (m_storage == glu::STORAGE_BUFFER)
			precedingInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY), "precedingMemberUnsizedArray"));
		else
			precedingInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), 2), "precedingMemberArray"));

		shader->getDefaultBlock().interfaceBlocks.push_back(precedingInterfaceBlock);
	}

	// TargetInterface
	{
		glu::InterfaceBlock targetInterfaceBlock;

		targetInterfaceBlock.interfaceName	= "TargetInterface";
		targetInterfaceBlock.layout.binding	= 1;
		targetInterfaceBlock.storage		= m_storage;

		if (m_caseType == CASE_UNNAMED_BLOCK)
			targetInterfaceBlock.instanceName = "";
		else
			targetInterfaceBlock.instanceName = "targetInstance";

		if (m_caseType == CASE_BLOCK_ARRAY)
			targetInterfaceBlock.dimensions.push_back(2);

		// Basic type
		{
			targetInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), "blockMemberBasic"));
		}

		// Array type
		{
			targetInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), 3), "blockMemberArray"));
		}

		// Struct type
		{
			glu::StructType* structPtr = new glu::StructType("StructType");
			structPtr->addMember("structMemberBasic", glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));
			structPtr->addMember("structMemberArray", glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), 2));

			targetInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(structPtr), 2), "blockMemberStruct"));
		}

		// Unsized array type
		if (m_storage == glu::STORAGE_BUFFER)
			targetInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY), "blockMemberUnsizedArray"));

		shader->getDefaultBlock().interfaceBlocks.push_back(targetInterfaceBlock);
	}

	// TrailingInterface
	{
		glu::InterfaceBlock trailingInterfaceBlock;

		trailingInterfaceBlock.interfaceName	= "TrailingInterface";
		trailingInterfaceBlock.layout.binding	= 3;
		trailingInterfaceBlock.storage			= m_storage;
		trailingInterfaceBlock.instanceName		= "trailingInstance";
		trailingInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), "trailingMember"));

		shader->getDefaultBlock().interfaceBlocks.push_back(trailingInterfaceBlock);
	}

	DE_ASSERT(m_program->isValid());
}